

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces.cpp
# Opt level: O1

void EBMOL::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_umac,MultiFab *a_vmac,MultiFab *a_wmac,Geometry *a_geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  Box *pBVar1;
  EBCellFlagFab *this;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  Long LVar9;
  FabType FVar10;
  int *piVar11;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  bool bVar22;
  Box local_3d4;
  Box local_3b8;
  Box local_39c;
  MultiCutFab *local_380;
  long local_378;
  FabArray<amrex::EBCellFlagFab> *local_370;
  FabArray<amrex::FArrayBox> *local_368;
  FabArray<amrex::FArrayBox> *local_360;
  FabArray<amrex::FArrayBox> *local_358;
  MultiCutFab *local_350;
  MultiCutFab *local_348;
  MultiCutFab *local_340;
  Array4<const_amrex::EBCellFlag> local_338;
  Array4<double> local_2f8;
  Array4<double> local_2b8;
  Array4<double> local_278;
  Box result;
  Box local_1ec;
  MFIter mfi;
  Array4<const_double> local_170;
  Array4<const_double> local_130;
  Array4<const_double> local_f0;
  Array4<const_double> vfrac;
  Array4<const_double> local_70;
  
  local_368 = &a_umac->super_FabArray<amrex::FArrayBox>;
  local_360 = &a_vmac->super_FabArray<amrex::FArrayBox>;
  local_358 = &a_wmac->super_FabArray<amrex::FArrayBox>;
  local_378 = __dynamic_cast((a_vel->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_378 == 0) {
    __cxa_bad_cast();
  }
  local_370 = amrex::EBDataCollection::getMultiEBCellFlagFab
                        (*(EBDataCollection **)(local_378 + 0xd8));
  amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(local_378 + 0xd8));
  local_380 = amrex::EBDataCollection::getCentroid(*(EBDataCollection **)(local_378 + 0xd8));
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_vel,true);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      amrex::MFIter::nodaltilebox(&local_39c,&mfi,0);
      amrex::MFIter::nodaltilebox(&local_3b8,&mfi,1);
      amrex::MFIter::nodaltilebox(&local_3d4,&mfi,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_278,local_368,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2b8,local_360,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2f8,local_358,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_170,&a_vel->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::MFIter::tilebox(&local_1ec,&mfi);
      piVar11 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar11 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      this = (local_370->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar11];
      local_338.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_338.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
      local_338.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_338.begin.x = (pBVar1->smallend).vect[0];
      local_338.begin.y = (pBVar1->smallend).vect[1];
      lVar16 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar17 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar14 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_338.jstride = (lVar17 - (pBVar1->smallend).vect[0]) + 1;
      local_338.kstride =
           (lVar16 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_338.jstride;
      local_338.nstride = (lVar14 - local_338.begin.z) * local_338.kstride;
      local_338.end._0_8_ = lVar17 + 1U & 0xffffffff | lVar16 << 0x20;
      local_338.end.z = (int)lVar14;
      result.bigend.vect[2] = local_1ec.bigend.vect[2];
      result.btype.itype = local_1ec.btype.itype;
      result.smallend.vect[0] = local_1ec.smallend.vect[0];
      result.smallend.vect[1] = local_1ec.smallend.vect[1];
      result.smallend.vect[2] = local_1ec.smallend.vect[2] + -2;
      result.bigend.vect[0] = local_1ec.bigend.vect[0] + 2;
      result.smallend.vect[1] = result.smallend.vect[1] + -2;
      result.smallend.vect[0] = result.smallend.vect[0] + -2;
      result.bigend.vect[1] = local_1ec.bigend.vect[1] + 2;
      result.bigend.vect[2] = result.bigend.vect[2] + 2;
      FVar10 = amrex::EBCellFlagFab::getType(this,&result);
      LVar9 = local_278.kstride;
      pdVar8 = local_278.p;
      iVar7 = local_39c.bigend.vect[2];
      iVar6 = local_39c.bigend.vect[1];
      iVar5 = local_39c.bigend.vect[0];
      iVar4 = local_39c.smallend.vect[1];
      iVar3 = local_39c.smallend.vect[0];
      if (FVar10 == singlevalued) {
        amrex::MultiCutFab::const_array((Array4<const_double> *)&result,local_350,&mfi);
        amrex::MultiCutFab::const_array(&local_70,local_348,&mfi);
        amrex::MultiCutFab::const_array(&local_f0,local_340,&mfi);
        amrex::MultiCutFab::const_array(&local_130,local_380,&mfi);
        this_00 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(local_378 + 0xd8))->
                   super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,this_00,&mfi);
        ExtrapVelToFacesBox(&local_39c,&local_3b8,&local_3d4,&local_278,&local_2b8,&local_2f8,
                            &local_170,&local_338,(Array4<const_double> *)&result,&local_70,
                            &local_f0,&local_130,&vfrac,a_geom,h_bcrec,d_bcrec);
      }
      else if (FVar10 == covered) {
        if (local_39c.smallend.vect[2] <= local_39c.bigend.vect[2]) {
          lVar14 = (long)local_278.begin.y;
          lVar16 = (long)local_278.begin.x;
          lVar17 = (long)local_39c.smallend.vect[1];
          lVar19 = (long)local_39c.smallend.vect[0];
          uVar12 = local_39c.bigend.vect[0] - local_39c.smallend.vect[0];
          iVar15 = local_39c.bigend.vect[1] - local_39c.smallend.vect[1];
          lVar20 = local_278.jstride * 8;
          iVar13 = local_39c.smallend.vect[2] - local_278.begin.z;
          iVar2 = local_39c.smallend.vect[2];
          do {
            if (iVar4 <= iVar6) {
              pvVar18 = (void *)((long)pdVar8 +
                                (iVar13 * LVar9 + lVar19) * 8 +
                                (lVar17 - lVar14) * lVar20 + lVar16 * -8);
              iVar21 = iVar15 + 1;
              do {
                if (iVar3 <= iVar5) {
                  memset(pvVar18,0,(ulong)uVar12 * 8 + 8);
                }
                pvVar18 = (void *)((long)pvVar18 + lVar20);
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            iVar13 = iVar13 + 1;
            bVar22 = iVar2 != iVar7;
            iVar2 = iVar2 + 1;
          } while (bVar22);
        }
        LVar9 = local_2b8.kstride;
        pdVar8 = local_2b8.p;
        iVar7 = local_3b8.bigend.vect[2];
        iVar6 = local_3b8.bigend.vect[1];
        iVar5 = local_3b8.bigend.vect[0];
        iVar4 = local_3b8.smallend.vect[1];
        iVar3 = local_3b8.smallend.vect[0];
        if (local_3b8.smallend.vect[2] <= local_3b8.bigend.vect[2]) {
          lVar14 = (long)local_2b8.begin.y;
          lVar16 = (long)local_2b8.begin.x;
          lVar17 = (long)local_3b8.smallend.vect[1];
          lVar19 = (long)local_3b8.smallend.vect[0];
          uVar12 = local_3b8.bigend.vect[0] - local_3b8.smallend.vect[0];
          iVar15 = local_3b8.bigend.vect[1] - local_3b8.smallend.vect[1];
          lVar20 = local_2b8.jstride * 8;
          iVar13 = local_3b8.smallend.vect[2] - local_2b8.begin.z;
          iVar2 = local_3b8.smallend.vect[2];
          do {
            if (iVar4 <= iVar6) {
              pvVar18 = (void *)((long)pdVar8 +
                                (iVar13 * LVar9 + lVar19) * 8 +
                                (lVar17 - lVar14) * lVar20 + lVar16 * -8);
              iVar21 = iVar15 + 1;
              do {
                if (iVar3 <= iVar5) {
                  memset(pvVar18,0,(ulong)uVar12 * 8 + 8);
                }
                pvVar18 = (void *)((long)pvVar18 + lVar20);
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            iVar13 = iVar13 + 1;
            bVar22 = iVar2 != iVar7;
            iVar2 = iVar2 + 1;
          } while (bVar22);
        }
        LVar9 = local_2f8.kstride;
        pdVar8 = local_2f8.p;
        iVar7 = local_3d4.bigend.vect[2];
        iVar6 = local_3d4.bigend.vect[1];
        iVar5 = local_3d4.bigend.vect[0];
        iVar4 = local_3d4.smallend.vect[1];
        iVar3 = local_3d4.smallend.vect[0];
        if (local_3d4.smallend.vect[2] <= local_3d4.bigend.vect[2]) {
          lVar14 = (long)local_2f8.begin.y;
          lVar16 = (long)local_2f8.begin.x;
          lVar17 = (long)local_3d4.smallend.vect[1];
          lVar19 = (long)local_3d4.smallend.vect[0];
          uVar12 = local_3d4.bigend.vect[0] - local_3d4.smallend.vect[0];
          iVar15 = local_3d4.bigend.vect[1] - local_3d4.smallend.vect[1];
          lVar20 = local_2f8.jstride * 8;
          iVar13 = local_3d4.smallend.vect[2] - local_2f8.begin.z;
          iVar2 = local_3d4.smallend.vect[2];
          do {
            if (iVar4 <= iVar6) {
              pvVar18 = (void *)((long)pdVar8 +
                                (iVar13 * LVar9 + lVar19) * 8 +
                                (lVar17 - lVar14) * lVar20 + lVar16 * -8);
              iVar21 = iVar15 + 1;
              do {
                if (iVar3 <= iVar5) {
                  memset(pvVar18,0,(ulong)uVar12 * 8 + 8);
                }
                pvVar18 = (void *)((long)pvVar18 + lVar20);
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            iVar13 = iVar13 + 1;
            bVar22 = iVar2 != iVar7;
            iVar2 = iVar2 + 1;
          } while (bVar22);
        }
      }
      else {
        MOL::ExtrapVelToFacesBox
                  (&local_39c,&local_3b8,&local_3d4,&local_278,&local_2b8,&local_2f8,&local_170,
                   a_geom,h_bcrec,d_bcrec);
      }
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
EBMOL::ExtrapVelToFaces ( const MultiFab&  a_vel,
                          AMREX_D_DECL( MultiFab& a_umac,
                                        MultiFab& a_vmac,
                                        MultiFab& a_wmac ),
                          const Geometry&  a_geom,
                          const Vector<BCRec>& h_bcrec,
                          BCRec  const* d_bcrec)
{
    BL_PROFILE("EBMOL::ExtrapVelToFaces");

#ifdef AMREX_USE_EB
    AMREX_ASSERT(a_vel.hasEBFabFactory());
    auto const& fact  = dynamic_cast<EBFArrayBoxFactory const&>(a_vel.Factory());
    auto const& flags = fact.getMultiEBCellFlagFab();
    auto const& fcent = fact.getFaceCent();
    auto const& ccent = fact.getCentroid();
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        for (MFIter mfi(a_vel, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            AMREX_D_TERM( Box const& ubx = mfi.nodaltilebox(0);,
                          Box const& vbx = mfi.nodaltilebox(1);,
                          Box const& wbx = mfi.nodaltilebox(2););

            AMREX_D_TERM( Array4<Real> const& u = a_umac.array(mfi);,
                          Array4<Real> const& v = a_vmac.array(mfi);,
                          Array4<Real> const& w = a_wmac.array(mfi););

            Array4<Real const> const& vcc = a_vel.const_array(mfi);

#ifdef AMREX_USE_EB
            Box const& bx = mfi.tilebox();
            EBCellFlagFab const& flagfab = flags[mfi];
            Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
            auto const typ = flagfab.getType(amrex::grow(bx,2));
            if (typ == FabType::covered)
            {
                amrex::ParallelFor(ubx, [u]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { u(i,j,k) = 0.0; });
                amrex::ParallelFor(vbx, [v]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { v(i,j,k) = 0.0; });
#if (AMREX_SPACEDIM==3)
                amrex::ParallelFor(wbx, [w]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept { w(i,j,k) = 0.0; });
#endif
            }
            else if (typ == FabType::singlevalued)
            {
                AMREX_D_TERM( Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                              Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                              Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

                Array4<Real const> const& ccc = ccent.const_array(mfi);
                auto vfrac = fact.getVolFrac().const_array(mfi);

                EBMOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                           AMREX_D_DECL(u,v,w),vcc,flagarr,
                                           AMREX_D_DECL(fcx,fcy,fcz),ccc, vfrac,
                                           a_geom, h_bcrec, d_bcrec);
            }
            else
#endif
            {
                MOL::ExtrapVelToFacesBox(AMREX_D_DECL(ubx,vbx,wbx),
                                         AMREX_D_DECL(u,v,w),
                                         vcc,a_geom,h_bcrec, d_bcrec);
            }
        }
    }

}